

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O2

bool __thiscall tinyxml2::XMLElement::Accept(XMLElement *this,XMLVisitor *visitor)

{
  XMLNode *pXVar1;
  int iVar2;
  XMLNode **ppXVar3;
  
  iVar2 = (*visitor->_vptr_XMLVisitor[4])(visitor,this,this->_rootAttribute);
  if ((char)iVar2 != '\0') {
    ppXVar3 = &(this->super_XMLNode)._firstChild;
    do {
      pXVar1 = *ppXVar3;
      if (pXVar1 == (XMLNode *)0x0) break;
      iVar2 = (*pXVar1->_vptr_XMLNode[0xe])(pXVar1,visitor);
      ppXVar3 = &pXVar1->_next;
    } while ((char)iVar2 != '\0');
  }
  iVar2 = (*visitor->_vptr_XMLVisitor[5])(visitor,this);
  return SUB41(iVar2,0);
}

Assistant:

bool XMLElement::Accept( XMLVisitor* visitor ) const
{
    TIXMLASSERT( visitor );
    if ( visitor->VisitEnter( *this, _rootAttribute ) ) {
        for ( const XMLNode* node=FirstChild(); node; node=node->NextSibling() ) {
            if ( !node->Accept( visitor ) ) {
                break;
            }
        }
    }
    return visitor->VisitExit( *this );
}